

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O0

void __thiscall btTriangleMesh::addIndex(btTriangleMesh *this,int index)

{
  uint *puVar1;
  btIndexedMesh *pbVar2;
  unsigned_short *puVar3;
  btAlignedObjectArray<unsigned_int> *in_RDI;
  uint *in_stack_ffffffffffffffd8;
  
  if ((in_RDI[7].m_capacity & 1) == 0) {
    btAlignedObjectArray<unsigned_short>::push_back
              ((btAlignedObjectArray<unsigned_short> *)in_RDI,
               (unsigned_short *)in_stack_ffffffffffffffd8);
    puVar3 = btAlignedObjectArray<unsigned_short>::operator[]
                       ((btAlignedObjectArray<unsigned_short> *)&in_RDI[6].m_capacity,0);
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)&in_RDI->m_ownsMemory,0);
    pbVar2->m_triangleIndexBase = (uchar *)puVar3;
  }
  else {
    btAlignedObjectArray<unsigned_int>::push_back(in_RDI,in_stack_ffffffffffffffd8);
    puVar1 = btAlignedObjectArray<unsigned_int>::operator[]
                       ((btAlignedObjectArray<unsigned_int> *)&in_RDI[5].m_capacity,0);
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)&in_RDI->m_ownsMemory,0);
    pbVar2->m_triangleIndexBase = (uchar *)puVar1;
  }
  return;
}

Assistant:

void	btTriangleMesh::addIndex(int index)
{
	if (m_use32bitIndices)
	{
		m_32bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_32bitIndices[0];
	} else
	{
		m_16bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_16bitIndices[0];
	}
}